

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O0

bool axl::io::getSymbolicLinkTarget(String *targetName,StringRef *linkName)

{
  int iVar1;
  C *pCVar2;
  C *__buf;
  ssize_t sVar3;
  char *p;
  size_t bufferLength;
  int result;
  stat linkStat;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff00;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff08;
  uint_t in_stack_ffffffffffffff2c;
  ErrorRef *in_stack_ffffffffffffff30;
  undefined1 local_a8 [23];
  undefined1 in_stack_ffffffffffffff6f;
  uint in_stack_ffffffffffffff70;
  __uid_t in_stack_ffffffffffffff74;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff78;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *local_78;
  bool local_1;
  
  memset(local_a8,0,0x90);
  pCVar2 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(in_stack_ffffffffffffff00)
  ;
  iVar1 = lstat(pCVar2,(stat *)local_a8);
  if (iVar1 == -1) {
    local_1 = err::failWithLastSystemError();
  }
  else if ((in_stack_ffffffffffffff70 & 0xf000) == 0xa000) {
    if (local_78 == (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x0) {
      local_78 = (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1000;
    }
    this = local_78;
    __buf = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer
                      (in_stack_ffffffffffffff78,
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (bool)in_stack_ffffffffffffff6f);
    if (__buf == (C *)0x0) {
      local_1 = false;
    }
    else {
      pCVar2 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(this);
      sVar3 = readlink(pCVar2,__buf,(size_t)local_78);
      if ((int)sVar3 == -1) {
        local_1 = err::failWithLastSystemError();
      }
      else {
        sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::overrideLength
                  (in_stack_ffffffffffffff08,(size_t)this);
        local_1 = true;
      }
    }
  }
  else {
    err::ErrorRef::ErrorRef(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    local_1 = err::fail((ErrorRef *)0x16e1ce);
    err::ErrorRef::~ErrorRef((ErrorRef *)0x16e1eb);
  }
  return local_1;
}

Assistant:

bool
getSymbolicLinkTarget(
	sl::String* targetName,
	const sl::StringRef& linkName
) {
	struct stat linkStat = { 0 };

	int result = ::lstat(linkName.sz(), &linkStat);
	if (result == -1)
		return err::failWithLastSystemError();

	if (!S_ISLNK(linkStat.st_mode))
		return err::fail(EINVAL);

	size_t bufferLength = linkStat.st_size ? linkStat.st_size : PATH_MAX;

	char* p = targetName->createBuffer(bufferLength);
	if (!p)
		return false;

	result = readlink(linkName.sz(), p, bufferLength);
	if (result == -1)
		return err::failWithLastSystemError();

	ASSERT(result <= bufferLength);
	targetName->overrideLength(result);
	return true;
}